

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O2

void __thiscall
anurbs::Entry<anurbs::Polyline<2L>_>::Entry
          (Entry<anurbs::Polyline<2L>_> *this,shared_ptr<anurbs::Polyline<2L>_> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__00392960;
  (this->m_key)._M_dataplus._M_p = (pointer)&(this->m_key).field_2;
  (this->m_key)._M_string_length = 0;
  (this->m_key).field_2._M_local_buf[0] = '\0';
  std::__shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_data).super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>,
             &data->super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_attributes).
              super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>,
             &attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

Entry(std::shared_ptr<TData> data, std::shared_ptr<Attributes> attributes)
        : m_data(data), m_attributes(attributes)
    {
    }